

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.cpp
# Opt level: O1

void __thiscall Span::Span(Span *this,void *sa,int s,int n,int a,int sc,int es)

{
  char *__s;
  
  this->allocCount = a;
  this->nelems = n;
  this->startAddr = sa;
  this->size = s;
  (this->bitmap).bitmap = (char *)0x0;
  __s = (char *)operator_new__((long)n);
  (this->bitmap).bitmap = __s;
  memset(__s,0,(long)n);
  (this->bitmap).size = n;
  this->spanClass = sc;
  this->elemsize = es;
  return;
}

Assistant:

Span::Span(void *sa, int s, int n, int a, int sc, int es)
    : startAddr(sa), size(s), nelems(n), allocCount(a), spanClass(sc),
      elemsize(es), bitmap(n) {}